

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_index_equalorlarger(run_container_t *arr,uint16_t x)

{
  rle16_t *prVar1;
  bool bVar2;
  int32_t *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  prVar1 = arr->runs;
  piVar3 = &arr->n_runs;
  iVar6 = *piVar3 + -1;
  uVar5 = 0;
  do {
    if (iVar6 < (int)uVar5) {
      uVar4 = ~uVar5;
      break;
    }
    uVar4 = uVar5 + iVar6 >> 1;
    if (prVar1[uVar4].value < x) {
      uVar5 = uVar4 + 1;
      bVar2 = true;
    }
    else if (x < prVar1[uVar4].value) {
      iVar6 = uVar4 - 1;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      arr = (run_container_t *)(ulong)uVar4;
    }
    uVar4 = (uint)arr;
  } while (bVar2);
  uVar5 = uVar4;
  if (((int)uVar4 < 0) &&
     ((uVar4 == 0xffffffff ||
      (uVar5 = -uVar4 - 2,
      (int)(uint)prVar1[uVar5].length < (int)((uint)x - (uint)prVar1[uVar5].value))))) {
    uVar5 = 0xffffffff;
    if ((int)~uVar4 < *piVar3) {
      uVar5 = ~uVar4;
    }
    return uVar5;
  }
  return uVar5;
}

Assistant:

inline int run_container_index_equalorlarger(const run_container_t *arr,
                                             uint16_t x) {
    int32_t index = interleavedBinarySearch(arr->runs, arr->n_runs, x);
    if (index >= 0) return index;
    index = -index - 2;  // points to preceding run, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = x - arr->runs[index].value;
        int32_t le = arr->runs[index].length;
        if (offset <= le) return index;
    }
    index += 1;
    if (index < arr->n_runs) {
        return index;
    }
    return -1;
}